

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubD::DeleteComponentsForExperts
          (ON_SubD *this,ON_SubDComponentPtr *cptr_list,size_t cptr_count,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ON_SubDimple *this_00;
  ON_SubDLevel *pOVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  unsigned_short vei;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  uint uVar10;
  ON_ComponentStatus OVar11;
  undefined3 in_register_00000089;
  uint max_level_index;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  size_t i_1;
  ON_ComponentStatus local_b6;
  uint local_b4;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentIterator cit;
  
  if (CONCAT31(in_register_00000089,bMarkDeletedFaceEdges) != 0) {
    ClearComponentMarks(this,false,true,false,(ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0);
  }
  if (cptr_count == 0) {
    return true;
  }
  if (((cptr_list == (ON_SubDComponentPtr *)0x0) ||
      (this_00 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr, this_00 == (ON_SubDimple *)0x0)) ||
     (uVar10 = (this_00->m_levels).m_count, uVar10 == 0)) {
LAB_005e7a1d:
    ON_SubDIncrementErrorCount();
    return false;
  }
  max_level_index = uVar10;
  for (sVar6 = 0; cptr_count != sVar6; sVar6 = sVar6 + 1) {
    uVar8 = cptr_list[sVar6].m_ptr & 0xfffffffffffffff8;
    if ((uVar8 != 0 && (cptr_list[sVar6].m_ptr & 6) != 0) &&
       (uVar14 = (uint)*(byte *)(uVar8 + 0x13), uVar14 <= max_level_index)) {
      max_level_index = uVar14;
    }
  }
  if ((max_level_index == uVar10) || (uVar10 <= max_level_index)) goto LAB_005e7a1d;
  this_00->m_active_level = (this_00->m_levels).m_a[max_level_index];
  ON_SubDimple::ClearHigherSubdivisionLevels(this_00,max_level_index);
  pOVar1 = this_00->m_active_level;
  if ((pOVar1 == (ON_SubDLevel *)0x0) || (pOVar1->m_level_index != max_level_index))
  goto LAB_005e7a1d;
  ON_SubDComponentIterator::ON_SubDComponentIterator(&cit,this);
  cptr = ON_SubDComponentIterator::FirstComponent(&cit);
  while ((7 < cptr.m_ptr && ((cptr.m_ptr & 6) != 0))) {
    local_b6 = ON_SubDComponentPtr::Status(&cptr);
    bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_b6);
    if (bVar3) {
      ON_SubDComponentPtr::ClearStates(&cptr,ON_ComponentStatus::Damaged);
    }
    cptr = ON_SubDComponentIterator::NextComponent(&cit);
  }
  local_b4 = CONCAT22(local_b4._2_2_,ON_ComponentStatus::AllSet);
  OVar11 = ON_ComponentStatus::AllSet;
  for (sVar6 = 0; sVar6 != cptr_count; sVar6 = sVar6 + 1) {
    cptr.m_ptr = cptr_list[sVar6].m_ptr;
    uVar13 = cptr.m_ptr & 6;
    uVar8 = cptr.m_ptr & 0xfffffffffffffff8;
    if ((uVar8 != 0 && uVar13 != 0) && (max_level_index == *(byte *)(uVar8 + 0x13))) {
      *(ON_ComponentStatus *)(uVar8 + 0x10) = OVar11;
      TVar4 = ON_SubDComponentPtr::ComponentType(&cptr);
      iVar12 = (int)uVar13;
      OVar11 = local_b4._0_2_;
      if (TVar4 == Edge) {
        if (iVar12 == 4) {
          puVar5 = (ulong *)(uVar8 + 0x68);
          for (uVar13 = 0; uVar13 < *(ushort *)(uVar8 + 100); uVar13 = uVar13 + 1) {
            puVar9 = puVar5;
            if (1 < uVar13) {
              puVar9 = (ulong *)(*(long *)(uVar8 + 0x78) + uVar13 * 8 + -0x10);
            }
            if ((*puVar9 & 0xfffffffffffffff8) != 0) {
              *(ON_ComponentStatus *)((*puVar9 & 0xfffffffffffffff8) + 0x10) = local_b4._0_2_;
            }
            puVar5 = puVar5 + 1;
          }
        }
      }
      else if ((TVar4 == Vertex) && (iVar12 == 2)) {
        for (uVar13 = 0; uVar13 < *(ushort *)(uVar8 + 0x68); uVar13 = uVar13 + 1) {
          uVar7 = *(ulong *)(*(long *)(uVar8 + 0x70) + uVar13 * 8) & 0xfffffffffffffff8;
          if (uVar7 != 0) {
            *(ON_ComponentStatus *)(uVar7 + 0x10) = local_b4._0_2_;
          }
        }
        for (uVar13 = 0; uVar13 < *(ushort *)(uVar8 + 0x6a); uVar13 = uVar13 + 1) {
          lVar2 = *(long *)(*(long *)(uVar8 + 0x78) + uVar13 * 8);
          if (lVar2 != 0) {
            *(ON_ComponentStatus *)(lVar2 + 0x10) = local_b4._0_2_;
          }
        }
      }
    }
  }
  cptr = ON_SubDComponentIterator::FirstComponent(&cit);
  local_b4 = 0;
  uVar10 = 0;
  uVar14 = 0;
  while ((7 < cptr.m_ptr && ((cptr.m_ptr & 6) != 0))) {
    local_b6 = ON_SubDComponentPtr::Status(&cptr);
    bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_b6);
    if (bVar3) {
      TVar4 = ON_SubDComponentPtr::ComponentType(&cptr);
      if (TVar4 == Vertex) {
        local_b4 = local_b4 + 1;
      }
      else if (TVar4 == Edge) {
        uVar10 = uVar10 + 1;
      }
      else if (TVar4 == Face) {
        uVar14 = uVar14 + 1;
      }
    }
    cptr = ON_SubDComponentIterator::NextComponent(&cit);
  }
  if ((local_b4 != 0 || uVar10 != 0) || uVar14 != 0) {
    if ((((pOVar1->m_vertex_count <= local_b4) || (pOVar1->m_edge_count <= uVar10)) ||
        (bDeleteIsolatedEdges && pOVar1->m_face_count <= uVar14)) ||
       (uVar10 = ON_SubDimple::DeleteComponents
                           (this_00,max_level_index,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients,
                            bMarkDeletedFaceEdges), (this_00->m_levels).m_count == 0)) {
      std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_subdimple_sp).
                  super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
      bVar3 = true;
      goto LAB_005e7c41;
    }
    bVar3 = uVar10 != 0;
    if (uVar10 != 0 || max_level_index != 0) {
      ON_SubDimple::ClearLowerSubdivisionLevels(this_00,max_level_index);
      goto LAB_005e7c41;
    }
  }
  bVar3 = false;
LAB_005e7c41:
  ON_SubDRef::~ON_SubDRef(&cit.m_subd_ref);
  return bVar3;
}

Assistant:

bool ON_SubD::DeleteComponentsForExperts(
  const ON_SubDComponentPtr* cptr_list,
  size_t cptr_count,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
)
{
  if (bMarkDeletedFaceEdges)
    ClearComponentMarks(false,true,false,nullptr);

  if ( cptr_count <= 0 )
    return true;

  if ( nullptr == cptr_list )
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDimple* subdimple = SubDimple(false);
  if ( nullptr == subdimple )
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned int level_count = subdimple->LevelCount();
  if (level_count <= 0)
    return ON_SUBD_RETURN_ERROR(false);
  
  unsigned level_index = level_count;
  for (size_t i = 0; i < cptr_count; i++)
  {
    const ON_SubDComponentBase* c = cptr_list[i].ComponentBase();
    if ( nullptr == c)
      continue;
    if ( c->SubdivisionLevel() < level_index )
      level_index = c->SubdivisionLevel();
  }
  if ( level_index == level_count )
    return ON_SUBD_RETURN_ERROR(false);

  if ( false == subdimple->SetActiveLevel(level_index) )
    return ON_SUBD_RETURN_ERROR(false);

  subdimple->ClearHigherSubdivisionLevels(level_index);
  const ON_SubDLevel* level = subdimple->ActiveLevelPointer();
  if ( nullptr == level || level->m_level_index != level_index)
    return ON_SUBD_RETURN_ERROR(false);

  // Make sure no components have a status = ON_ComponentStatus::AllSet
  // because this uncommon status value is used to mark components that will be be deleted.
  ON_SubDComponentIterator cit(*this);
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if ( ON_ComponentStatus::AllSet == cptr.Status() )
      cptr.ClearStates(ON_ComponentStatus::Damaged);
  }

  // Set the status of every component in cptr_list[] to ON_ComponentStatus::AllSet.
  // If that component is a vertex, set the status of every edge and face that
  // touch the vertex to ON_ComponentStatus::AllSet.
  // If that component is an edge, set the status of every face that
  // touches the edge to ON_ComponentStatus::AllSet.
  for (size_t i = 0; i < cptr_count; i++)
  {
    ON_SubDComponentPtr cptr = cptr_list[i];
    const ON_SubDComponentBase* c = cptr.ComponentBase();
    if (nullptr == c)
      continue;
    if (c->SubdivisionLevel() != level_index)
      continue;
    c->m_status = ON_ComponentStatus::AllSet;
    switch (cptr.ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      {
        const ON_SubDVertex* vertex = cptr.Vertex();
        if (nullptr == vertex)
          continue;
        for (unsigned short vei = 0; vei < vertex->m_edge_count; vei++)
        {
          const ON_SubDEdge* edge = vertex->Edge(vei);
          if (nullptr == edge)
            continue;
          edge->m_status = ON_ComponentStatus::AllSet;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; vfi++)
        {
          const ON_SubDFace* face = vertex->Face(vfi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Edge:
      {
        const ON_SubDEdge* edge = cptr.Edge();
        if (nullptr == edge)
          continue;
        edge->m_status = ON_ComponentStatus::AllSet;
        for (unsigned short efi = 0; efi < edge->m_face_count; efi++)
        {
          const ON_SubDFace* face = edge->Face(efi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Face:
      {
        const ON_SubDFace* face = cptr.Face();
        if (nullptr == face)
          continue;
        face->m_status = ON_ComponentStatus::AllSet;
      }
      break;
            
    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }

  // Minimum count of what will be deleted. (
  unsigned int deleted_vertex_count = 0;
  unsigned int deleted_edge_count = 0;
  unsigned int deleted_face_count = 0;
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if (ON_ComponentStatus::AllSet == cptr.Status())
    {
      switch (cptr.ComponentType())
      {
      case ON_SubDComponentPtr::Type::Vertex:
        deleted_vertex_count++;
        break;

      case ON_SubDComponentPtr::Type::Edge:
        deleted_edge_count++;
        break;

      case ON_SubDComponentPtr::Type::Face:
        deleted_face_count++;
        break;
      case ON_SubDComponentPtr::Type::Unset:
        break;
      }
      continue;
    }
  }

  if ( 0 == deleted_vertex_count && 0 == deleted_edge_count && 0 ==  deleted_face_count )
    return false;

  const bool bDestroy
    = deleted_vertex_count >= level->m_vertex_count
    || deleted_edge_count >= level->m_edge_count
    || (deleted_face_count >= level->m_face_count && bDeleteIsolatedEdges)
    ;
  if (bDestroy)
  {
    Destroy();
    return true;
  }

  unsigned int deleted_component_count = subdimple->DeleteComponents(level_index,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients,bMarkDeletedFaceEdges);

  if (0 == subdimple->LevelCount())
  {
    Destroy();
    return true;
  }

  if (deleted_component_count > 0 || level_index > 0)
  {
    // remove lower levels
    subdimple->ClearLowerSubdivisionLevels(level_index);
  }

  return (deleted_component_count > 0);
}